

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignExtLowering.cpp
# Opt level: O2

void __thiscall
wasm::SignExtLowering::lowerToShifts<int>
          (SignExtLowering *this,Expression *value,BinaryOp leftShift,BinaryOp rightShift,
          int originalBits)

{
  Const *pCVar1;
  Binary *pBVar2;
  Builder local_40;
  Builder builder;
  
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
       ).super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>.
       super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>.currModule;
  builder.wasm._4_4_ = rightShift;
  pCVar1 = Builder::makeConst<int>(&local_40,0x20 - originalBits);
  pBVar2 = Builder::makeBinary(&local_40,leftShift,value,(Expression *)pCVar1);
  pCVar1 = Builder::makeConst<int>(&local_40,0x20 - originalBits);
  pBVar2 = Builder::makeBinary(&local_40,builder.wasm._4_4_,(Expression *)pBVar2,
                               (Expression *)pCVar1);
  Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>_>
              ).super_PostWalker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>
              .super_Walker<wasm::SignExtLowering,_wasm::Visitor<wasm::SignExtLowering,_void>_>,
             (Expression *)pBVar2);
  return;
}

Assistant:

void lowerToShifts(Expression* value,
                     BinaryOp leftShift,
                     BinaryOp rightShift,
                     T originalBits) {
    // To sign-extend, we shift all the way left so the effective sign bit is
    // where the actual sign bit is. For example, when sign-extending i8, the
    // effective sign bit is at bit 8, and we shift it to the actual place of
    // the sign bit, which is 32 for i32 or 64 for i64. Then we do a signed
    // shift in the other direction, which fills with the proper bit all the
    // way back, so e.g.
    //
    //  0x000000ff  =(shift left)=>  0xff000000  =(shift right)=>  0xffffffff
    //
    T shiftBits = (sizeof(T) * 8) - originalBits;
    Builder builder(*getModule());
    replaceCurrent(builder.makeBinary(
      rightShift,
      builder.makeBinary(leftShift, value, builder.makeConst(shiftBits)),
      builder.makeConst(shiftBits)));
  }